

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void llb_buildsystem_command_interface_task_discovered_dependency
               (llb_task_interface_t ti,llb_build_key_t *key)

{
  BuildKey *this;
  KeyType local_48;
  TaskInterface *local_28;
  TaskInterface *coreti;
  llb_build_key_t *key_local;
  llb_task_interface_t ti_local;
  
  ti_local.impl = ti.ctx;
  key_local = (llb_build_key_t *)ti.impl;
  local_28 = (TaskInterface *)&key_local;
  coreti = (TaskInterface *)key;
  this = anon_unknown.dwarf_1b8a13::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  llbuild::buildsystem::BuildKey::toData(&local_48,this);
  llbuild::core::TaskInterface::discoveredDependency((TaskInterface *)&key_local,&local_48);
  llbuild::core::KeyType::~KeyType(&local_48);
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_discovered_dependency(llb_task_interface_t ti, llb_build_key_t* key) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->discoveredDependency(((CAPIBuildKey *)key)->getInternalBuildKey().toData());
}